

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

ssize_t __thiscall DomResourceIcon::write(DomResourceIcon *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  undefined4 in_register_00000034;
  QString *str_00;
  long in_FS_OFFSET;
  char16_t *str;
  DomResourceIcon *in_stack_fffffffffffffd68;
  QArrayDataPointer<char16_t> *in_stack_fffffffffffffd70;
  DomResourcePixmap *pDVar2;
  QString *in_stack_fffffffffffffd78;
  DomResourcePixmap *in_stack_fffffffffffffd80;
  QString *in_stack_fffffffffffffd88;
  undefined1 local_1a8 [24];
  undefined1 local_190 [24];
  undefined1 local_178 [24];
  undefined1 local_160 [24];
  undefined1 local_148 [24];
  undefined1 local_130 [24];
  undefined1 local_118 [24];
  undefined1 local_100 [48];
  size_t local_d0;
  QAnyStringView *local_a8;
  size_t local_80;
  QAnyStringView *local_58;
  QArrayDataPointer<char16_t> local_48 [2];
  long local_8;
  
  str_00 = (QString *)CONCAT44(in_register_00000034,__fd);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QString::isEmpty((QString *)0x1bf621);
  if (bVar1) {
    __n = 0xc;
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_48,(Data *)0x0,L"resourceicon",0xc);
    QString::QString((QString *)in_stack_fffffffffffffd70,(DataPointer *)in_stack_fffffffffffffd68);
  }
  else {
    QString::toLower(&in_stack_fffffffffffffd68->m_text);
  }
  QAnyStringView::QAnyStringView
            ((QAnyStringView *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  QXmlStreamWriter::writeStartElement((QAnyStringView *)str_00);
  QString::~QString((QString *)0x1bf6ef);
  if (bVar1) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffd70);
  }
  bVar1 = hasAttributeTheme(this);
  if (bVar1) {
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffd88,(size_t)in_stack_fffffffffffffd80);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    attributeTheme(in_stack_fffffffffffffd68);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    QXmlStreamWriter::writeAttribute((QAnyStringView *)str_00,local_58);
    QString::~QString((QString *)0x1bf7c0);
    QString::~QString((QString *)0x1bf7cd);
    __n = local_80;
  }
  bVar1 = hasAttributeResource(this);
  if (bVar1) {
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffd88,(size_t)in_stack_fffffffffffffd80);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    attributeResource(in_stack_fffffffffffffd68);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    QXmlStreamWriter::writeAttribute((QAnyStringView *)str_00,local_a8);
    QString::~QString((QString *)0x1bf885);
    QString::~QString((QString *)0x1bf892);
    __n = local_d0;
  }
  if ((this->m_children & 1) != 0) {
    pDVar2 = this->m_normalOff;
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffd88,(size_t)in_stack_fffffffffffffd80);
    DomResourcePixmap::write(pDVar2,__fd,local_100,__n);
    QString::~QString((QString *)0x1bf906);
  }
  if ((this->m_children & 2) != 0) {
    pDVar2 = this->m_normalOn;
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffd88,(size_t)in_stack_fffffffffffffd80);
    DomResourcePixmap::write(pDVar2,__fd,local_118,__n);
    QString::~QString((QString *)0x1bf974);
  }
  if ((this->m_children & 4) != 0) {
    pDVar2 = this->m_disabledOff;
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffd88,(size_t)in_stack_fffffffffffffd80);
    DomResourcePixmap::write(pDVar2,__fd,local_130,__n);
    QString::~QString((QString *)0x1bf9e2);
  }
  if ((this->m_children & 8) != 0) {
    pDVar2 = this->m_disabledOn;
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffd88,(size_t)in_stack_fffffffffffffd80);
    DomResourcePixmap::write(pDVar2,__fd,local_148,__n);
    QString::~QString((QString *)0x1bfa50);
  }
  if ((this->m_children & 0x10) != 0) {
    pDVar2 = this->m_activeOff;
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffd88,(size_t)in_stack_fffffffffffffd80);
    DomResourcePixmap::write(pDVar2,__fd,local_160,__n);
    QString::~QString((QString *)0x1bfabe);
  }
  if ((this->m_children & 0x20) != 0) {
    pDVar2 = this->m_activeOn;
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffd88,(size_t)in_stack_fffffffffffffd80);
    DomResourcePixmap::write(pDVar2,__fd,local_178,__n);
    QString::~QString((QString *)0x1bfb2f);
  }
  if ((this->m_children & 0x40) != 0) {
    in_stack_fffffffffffffd80 = this->m_selectedOff;
    in_stack_fffffffffffffd88 = str_00;
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)str_00,(size_t)in_stack_fffffffffffffd80);
    DomResourcePixmap::write(in_stack_fffffffffffffd80,(int)in_stack_fffffffffffffd88,local_190,__n)
    ;
    QString::~QString((QString *)0x1bfba0);
  }
  if ((this->m_children & 0x80) != 0) {
    pDVar2 = this->m_selectedOn;
    in_stack_fffffffffffffd78 = str_00;
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffd88,(size_t)in_stack_fffffffffffffd80);
    DomResourcePixmap::write(pDVar2,(int)in_stack_fffffffffffffd78,local_1a8,__n);
    QString::~QString((QString *)0x1bfc13);
  }
  bVar1 = QString::isEmpty((QString *)0x1bfc20);
  if (!bVar1) {
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    QXmlStreamWriter::writeCharacters((QAnyStringView *)str_00);
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomResourceIcon::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("resourceicon") : tagName.toLower());

    if (hasAttributeTheme())
        writer.writeAttribute(u"theme"_s, attributeTheme());

    if (hasAttributeResource())
        writer.writeAttribute(u"resource"_s, attributeResource());

    if (m_children & NormalOff)
        m_normalOff->write(writer, u"normaloff"_s);

    if (m_children & NormalOn)
        m_normalOn->write(writer, u"normalon"_s);

    if (m_children & DisabledOff)
        m_disabledOff->write(writer, u"disabledoff"_s);

    if (m_children & DisabledOn)
        m_disabledOn->write(writer, u"disabledon"_s);

    if (m_children & ActiveOff)
        m_activeOff->write(writer, u"activeoff"_s);

    if (m_children & ActiveOn)
        m_activeOn->write(writer, u"activeon"_s);

    if (m_children & SelectedOff)
        m_selectedOff->write(writer, u"selectedoff"_s);

    if (m_children & SelectedOn)
        m_selectedOn->write(writer, u"selectedon"_s);

    if (!m_text.isEmpty())
        writer.writeCharacters(m_text);

    writer.writeEndElement();
}